

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O0

SinkNextBatchType __thiscall
duckdb::PhysicalBatchCopyToFile::NextBatch
          (PhysicalBatchCopyToFile *this,ExecutionContext *context,OperatorSinkNextBatchInput *input
          )

{
  FixedBatchCopyLocalState *pFVar1;
  FixedBatchCopyGlobalState *this_00;
  idx_t in_RDX;
  BatchMemoryManager *in_RSI;
  BatchMemoryManager *memory_manager;
  FixedBatchCopyGlobalState *gstate;
  FixedBatchCopyLocalState *state;
  LocalSinkState *lstate;
  GlobalSinkState *in_stack_ffffffffffffffb0;
  PhysicalOperator *in_stack_ffffffffffffffc0;
  ClientContext *context_00;
  
  pFVar1 = LocalSinkState::Cast<duckdb::FixedBatchCopyLocalState>
                     ((LocalSinkState *)in_stack_ffffffffffffffb0);
  this_00 = GlobalSinkState::Cast<duckdb::FixedBatchCopyGlobalState>(in_stack_ffffffffffffffb0);
  context_00 = (ClientContext *)&this_00->memory_manager;
  AddLocalBatch((PhysicalBatchCopyToFile *)input,(ClientContext *)lstate,(GlobalSinkState *)state,
                (LocalSinkState *)gstate);
  optional_idx::GetIndex((optional_idx *)in_RSI);
  BatchMemoryManager::UpdateMinBatchIndex(in_RSI,in_RDX);
  optional_idx::GetIndex((optional_idx *)in_RSI);
  optional_idx::optional_idx((optional_idx *)in_RSI,in_RDX);
  (pFVar1->batch_index).index = (idx_t)in_stack_ffffffffffffffc0;
  FixedBatchCopyLocalState::InitializeCollection
            ((FixedBatchCopyLocalState *)this_00,context_00,in_stack_ffffffffffffffc0);
  return READY;
}

Assistant:

SinkNextBatchType PhysicalBatchCopyToFile::NextBatch(ExecutionContext &context,
                                                     OperatorSinkNextBatchInput &input) const {
	auto &lstate = input.local_state;
	auto &state = lstate.Cast<FixedBatchCopyLocalState>();
	auto &gstate = input.global_state.Cast<FixedBatchCopyGlobalState>();
	auto &memory_manager = gstate.memory_manager;

	// add the previously finished batch (if any) to the state
	AddLocalBatch(context.client, gstate, state);

	// update the minimum batch index
	memory_manager.UpdateMinBatchIndex(state.partition_info.min_batch_index.GetIndex());
	state.batch_index = lstate.partition_info.batch_index.GetIndex();

	state.InitializeCollection(context.client, *this);
	return SinkNextBatchType::READY;
}